

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DoFilter6_SSE2(__m128i *p2,__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,__m128i *q2,
                   __m128i *mask,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i a0_hi;
  __m128i a0_lo;
  __m128i a1_hi;
  __m128i a1_lo;
  __m128i a2_hi;
  __m128i a2_lo;
  __m128i f9_hi;
  __m128i f9_lo;
  __m128i f_hi;
  __m128i f_lo;
  __m128i f_1;
  __m128i m_1;
  __m128i k63;
  __m128i k9;
  __m128i f;
  __m128i m;
  __m128i not_hev;
  __m128i a;
  __m128i sign_bit;
  __m128i zero;
  short local_488;
  short sStackY_486;
  short sStackY_484;
  short sStackY_482;
  short sStackY_480;
  short sStackY_47e;
  short sStackY_47c;
  short sStackY_47a;
  short local_478;
  short sStackY_476;
  short sStackY_474;
  short sStackY_472;
  short sStackY_470;
  short sStackY_46e;
  short sStackY_46c;
  short sStackY_46a;
  short local_468;
  short sStackY_466;
  short sStackY_464;
  short sStackY_462;
  short sStackY_460;
  short sStackY_45e;
  short sStackY_45c;
  short sStackY_45a;
  short local_458;
  short sStackY_456;
  short sStackY_454;
  short sStackY_452;
  undefined2 in_stack_fffffffffffffbb0;
  undefined2 in_stack_fffffffffffffbb2;
  undefined2 in_stack_fffffffffffffbb4;
  undefined2 in_stack_fffffffffffffbb6;
  undefined2 in_stack_fffffffffffffbb8;
  undefined2 in_stack_fffffffffffffbba;
  undefined2 in_stack_fffffffffffffbbc;
  undefined2 in_stack_fffffffffffffbbe;
  undefined2 in_stack_fffffffffffffbc0;
  undefined2 in_stack_fffffffffffffbc2;
  undefined2 in_stack_fffffffffffffbc4;
  undefined2 in_stack_fffffffffffffbc6;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408;
  undefined1 uStack_407;
  undefined1 uStack_406;
  undefined1 uStack_405;
  undefined1 uStack_404;
  undefined1 uStack_403;
  undefined1 uStack_402;
  undefined1 uStack_401;
  undefined1 uStack_400;
  undefined1 uStack_3ff;
  undefined1 uStack_3fe;
  undefined1 uStack_3fd;
  undefined1 uStack_3fc;
  undefined1 uStack_3fb;
  undefined1 uStack_3fa;
  undefined1 uStack_3f9;
  undefined1 local_3f8;
  undefined1 uStack_3f7;
  undefined1 uStack_3f6;
  undefined1 uStack_3f5;
  undefined1 uStack_3f4;
  undefined1 uStack_3f3;
  undefined1 uStack_3f2;
  undefined1 uStack_3f1;
  undefined1 uStack_3f0;
  undefined1 uStack_3ef;
  undefined1 uStack_3ee;
  undefined1 uStack_3ed;
  undefined1 uStack_3ec;
  undefined1 uStack_3eb;
  undefined1 uStack_3ea;
  undefined1 uStack_3e9;
  ulong local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a8;
  ulong uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  __m128i *local_340;
  __m128i *local_338;
  __m128i *local_330;
  __m128i *local_328;
  __m128i *local_320;
  __m128i *local_318;
  undefined2 local_30c;
  undefined2 local_30a;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined2 local_1c8;
  undefined2 local_1c6;
  undefined2 local_1c4;
  undefined2 local_1c2;
  undefined2 local_1c0;
  undefined2 local_1be;
  undefined2 local_1bc;
  undefined2 local_1ba;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined2 local_19a;
  undefined2 local_198;
  undefined2 local_196;
  undefined2 local_194;
  undefined2 local_192;
  undefined2 local_190;
  undefined2 local_18e;
  undefined2 local_18c;
  undefined1 local_189;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  ulong local_b8;
  ulong uStack_b0;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  ulong local_38;
  ulong uStack_30;
  ulong local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_208 = 0;
  uStack_200 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_189 = 0x80;
  local_109 = 0x80;
  local_10a = 0x80;
  local_10b = 0x80;
  local_10c = 0x80;
  local_10d = 0x80;
  local_10e = 0x80;
  local_10f = 0x80;
  local_110 = 0x80;
  local_111 = 0x80;
  local_112 = 0x80;
  local_113 = 0x80;
  local_114 = 0x80;
  local_115 = 0x80;
  local_116 = 0x80;
  local_117 = 0x80;
  local_118 = 0x80;
  local_368 = 0x8080808080808080;
  uStack_360 = 0x8080808080808080;
  local_340 = in_R9;
  local_338 = in_R8;
  local_330 = in_RCX;
  local_328 = in_RDX;
  local_320 = in_RSI;
  local_318 = in_RDI;
  local_128 = local_368;
  uStack_120 = uStack_360;
  GetNotHEV_SSE2(in_RSI,in_RDX,in_RCX,in_R8,(int)a0_lo[0],(__m128i *)&local_388);
  local_58 = (*local_320)[0];
  uStack_50 = (*local_320)[1];
  local_68 = local_368;
  uStack_60 = uStack_360;
  (*local_320)[0] = local_58 ^ local_368;
  (*local_320)[1] = uStack_50 ^ uStack_360;
  local_78 = (*local_328)[0];
  uStack_70 = (*local_328)[1];
  local_88 = local_368;
  uStack_80 = uStack_360;
  (*local_328)[0] = local_78 ^ local_368;
  (*local_328)[1] = uStack_70 ^ uStack_360;
  local_98 = (*local_330)[0];
  uStack_90 = (*local_330)[1];
  local_a8 = local_368;
  uStack_a0 = uStack_360;
  (*local_330)[0] = local_98 ^ local_368;
  (*local_330)[1] = uStack_90 ^ uStack_360;
  local_b8 = (*local_338)[0];
  uStack_b0 = (*local_338)[1];
  local_c8 = local_368;
  uStack_c0 = uStack_360;
  (*local_338)[0] = local_b8 ^ local_368;
  (*local_338)[1] = uStack_b0 ^ uStack_360;
  local_d8 = (*local_318)[0];
  uStack_d0 = (*local_318)[1];
  local_e8 = local_368;
  uStack_e0 = uStack_360;
  (*local_318)[0] = local_d8 ^ local_368;
  (*local_318)[1] = uStack_d0 ^ uStack_360;
  local_f8 = (*local_340)[0];
  uStack_f0 = (*local_340)[1];
  local_108 = local_368;
  uStack_100 = uStack_360;
  (*local_340)[0] = local_f8 ^ local_368;
  (*local_340)[1] = uStack_f0 ^ uStack_360;
  GetBaseDelta_SSE2(local_320,local_328,local_330,local_338,(__m128i *)&local_378);
  local_48 = *(ulong *)a0_hi[1];
  uStack_40 = *(ulong *)(a0_hi[1] + 8);
  local_38 = local_388;
  uStack_30 = uStack_380;
  local_398 = ~local_388 & local_48;
  uStack_390 = ~uStack_380 & uStack_40;
  local_138 = local_378;
  uStack_130 = uStack_370;
  local_3a8 = local_378 & local_398;
  uStack_3a0 = uStack_370 & uStack_390;
  local_148 = local_398;
  uStack_140 = uStack_390;
  DoSimpleFilter_SSE2((__m128i *)
                      CONCAT26(in_stack_fffffffffffffbc6,
                               CONCAT24(in_stack_fffffffffffffbc4,
                                        CONCAT22(in_stack_fffffffffffffbc2,in_stack_fffffffffffffbc0
                                                ))),
                      (__m128i *)
                      CONCAT26(in_stack_fffffffffffffbbe,
                               CONCAT24(in_stack_fffffffffffffbbc,
                                        CONCAT22(in_stack_fffffffffffffbba,in_stack_fffffffffffffbb8
                                                ))),
                      (__m128i *)
                      CONCAT26(in_stack_fffffffffffffbb6,
                               CONCAT24(in_stack_fffffffffffffbb4,
                                        CONCAT22(in_stack_fffffffffffffbb2,in_stack_fffffffffffffbb0
                                                ))));
  local_30a = 0x900;
  local_1ba = 0x900;
  local_1bc = 0x900;
  local_1be = 0x900;
  local_1c0 = 0x900;
  local_1c2 = 0x900;
  local_1c4 = 0x900;
  local_1c6 = 0x900;
  local_1c8 = 0x900;
  local_3b8 = 0x900090009000900;
  uStack_3b0 = 0x900090009000900;
  local_30c = 0x3f;
  local_18c = 0x3f;
  local_18e = 0x3f;
  local_190 = 0x3f;
  local_192 = 0x3f;
  local_194 = 0x3f;
  local_196 = 0x3f;
  local_198 = 0x3f;
  local_19a = 0x3f;
  local_3c8 = 0x3f003f003f003f;
  uStack_3c0 = 0x3f003f003f003f;
  local_168 = *(ulong *)a0_hi[1];
  uStack_160 = *(ulong *)(a0_hi[1] + 8);
  local_158 = local_388;
  uStack_150 = uStack_380;
  local_3d8 = local_388 & local_168;
  uStack_3d0 = uStack_380 & uStack_160;
  local_178 = local_378;
  uStack_170 = uStack_370;
  local_3e8 = local_378 & local_3d8;
  uStack_3e0 = uStack_370 & uStack_3d0;
  local_1e8 = local_358;
  uVar9 = local_1e8;
  uStack_1e0 = uStack_350;
  local_1e8._0_1_ = (undefined1)local_358;
  local_1e8._1_1_ = (undefined1)((ulong)local_358 >> 8);
  local_1e8._2_1_ = (undefined1)((ulong)local_358 >> 0x10);
  local_1e8._3_1_ = (undefined1)((ulong)local_358 >> 0x18);
  local_1e8._4_1_ = (undefined1)((ulong)local_358 >> 0x20);
  local_1e8._5_1_ = (undefined1)((ulong)local_358 >> 0x28);
  local_1e8._6_1_ = (undefined1)((ulong)local_358 >> 0x30);
  local_1e8._7_1_ = (undefined1)((ulong)local_358 >> 0x38);
  local_1f8._0_1_ = (undefined1)local_3e8;
  local_1f8._1_1_ = (undefined1)(local_3e8 >> 8);
  local_1f8._2_1_ = (undefined1)(local_3e8 >> 0x10);
  local_1f8._3_1_ = (undefined1)(local_3e8 >> 0x18);
  local_1f8._4_1_ = (undefined1)(local_3e8 >> 0x20);
  local_1f8._5_1_ = (undefined1)(local_3e8 >> 0x28);
  local_1f8._6_1_ = (undefined1)(local_3e8 >> 0x30);
  local_1f8._7_1_ = (undefined1)(local_3e8 >> 0x38);
  local_3f8 = (undefined1)local_1e8;
  uStack_3f7 = (undefined1)local_1f8;
  uStack_3f6 = local_1e8._1_1_;
  uStack_3f5 = local_1f8._1_1_;
  uStack_3f4 = local_1e8._2_1_;
  uStack_3f3 = local_1f8._2_1_;
  uStack_3f2 = local_1e8._3_1_;
  uStack_3f1 = local_1f8._3_1_;
  uStack_3f0 = local_1e8._4_1_;
  uStack_3ef = local_1f8._4_1_;
  uStack_3ee = local_1e8._5_1_;
  uStack_3ed = local_1f8._5_1_;
  uStack_3ec = local_1e8._6_1_;
  uStack_3eb = local_1f8._6_1_;
  uStack_3ea = local_1e8._7_1_;
  uStack_3e9 = local_1f8._7_1_;
  local_18 = local_358;
  uStack_10 = uStack_350;
  uVar10 = uStack_10;
  uStack_10._0_1_ = (undefined1)uStack_350;
  uStack_10._1_1_ = (undefined1)((ulong)uStack_350 >> 8);
  uStack_10._2_1_ = (undefined1)((ulong)uStack_350 >> 0x10);
  uStack_10._3_1_ = (undefined1)((ulong)uStack_350 >> 0x18);
  uStack_10._4_1_ = (undefined1)((ulong)uStack_350 >> 0x20);
  uStack_10._5_1_ = (undefined1)((ulong)uStack_350 >> 0x28);
  uStack_10._6_1_ = (undefined1)((ulong)uStack_350 >> 0x30);
  uStack_10._7_1_ = (undefined1)((ulong)uStack_350 >> 0x38);
  uStack_20._0_1_ = (undefined1)uStack_3e0;
  uStack_20._1_1_ = (undefined1)(uStack_3e0 >> 8);
  uStack_20._2_1_ = (undefined1)(uStack_3e0 >> 0x10);
  uStack_20._3_1_ = (undefined1)(uStack_3e0 >> 0x18);
  uStack_20._4_1_ = (undefined1)(uStack_3e0 >> 0x20);
  uStack_20._5_1_ = (undefined1)(uStack_3e0 >> 0x28);
  uStack_20._6_1_ = (undefined1)(uStack_3e0 >> 0x30);
  uStack_20._7_1_ = (undefined1)(uStack_3e0 >> 0x38);
  local_408 = (undefined1)uStack_10;
  uStack_407 = (undefined1)uStack_20;
  uStack_406 = uStack_10._1_1_;
  uStack_405 = uStack_20._1_1_;
  uStack_404 = uStack_10._2_1_;
  uStack_403 = uStack_20._2_1_;
  uStack_402 = uStack_10._3_1_;
  uStack_401 = uStack_20._3_1_;
  uStack_400 = uStack_10._4_1_;
  uStack_3ff = uStack_20._4_1_;
  uStack_3fe = uStack_10._5_1_;
  uStack_3fd = uStack_20._5_1_;
  uStack_3fc = uStack_10._6_1_;
  uStack_3fb = uStack_20._6_1_;
  uStack_3fa = uStack_10._7_1_;
  uStack_3f9 = uStack_20._7_1_;
  local_218 = CONCAT17(local_1f8._3_1_,
                       CONCAT16(local_1e8._3_1_,
                                CONCAT15(local_1f8._2_1_,
                                         CONCAT14(local_1e8._2_1_,
                                                  CONCAT13(local_1f8._1_1_,
                                                           CONCAT12(local_1e8._1_1_,
                                                                    CONCAT11((undefined1)local_1f8,
                                                                             (undefined1)local_1e8))
                                                          )))));
  uStack_210 = CONCAT17(local_1f8._7_1_,
                        CONCAT16(local_1e8._7_1_,
                                 CONCAT15(local_1f8._6_1_,
                                          CONCAT14(local_1e8._6_1_,
                                                   CONCAT13(local_1f8._5_1_,
                                                            CONCAT12(local_1e8._5_1_,
                                                                     CONCAT11(local_1f8._4_1_,
                                                                              local_1e8._4_1_)))))))
  ;
  auVar4._8_8_ = uStack_210;
  auVar4._0_8_ = local_218;
  auVar3._8_8_ = 0x900090009000900;
  auVar3._0_8_ = 0x900090009000900;
  local_418 = pmulhw(auVar4,auVar3);
  local_238 = CONCAT17(uStack_20._3_1_,
                       CONCAT16(uStack_10._3_1_,
                                CONCAT15(uStack_20._2_1_,
                                         CONCAT14(uStack_10._2_1_,
                                                  CONCAT13(uStack_20._1_1_,
                                                           CONCAT12(uStack_10._1_1_,
                                                                    CONCAT11((undefined1)uStack_20,
                                                                             (undefined1)uStack_10))
                                                          )))));
  uStack_230 = CONCAT17(uStack_20._7_1_,
                        CONCAT16(uStack_10._7_1_,
                                 CONCAT15(uStack_20._6_1_,
                                          CONCAT14(uStack_10._6_1_,
                                                   CONCAT13(uStack_20._5_1_,
                                                            CONCAT12(uStack_10._5_1_,
                                                                     CONCAT11(uStack_20._4_1_,
                                                                              uStack_10._4_1_)))))))
  ;
  auVar2._8_8_ = uStack_230;
  auVar2._0_8_ = local_238;
  auVar1._8_8_ = 0x900090009000900;
  auVar1._0_8_ = 0x900090009000900;
  local_428 = pmulhw(auVar2,auVar1);
  local_258 = local_418._0_8_;
  uVar7 = local_258;
  uStack_250 = local_418._8_8_;
  uVar8 = uStack_250;
  local_258._0_2_ = local_418._0_2_;
  local_258._2_2_ = local_418._2_2_;
  local_258._4_2_ = local_418._4_2_;
  local_258._6_2_ = local_418._6_2_;
  uStack_250._0_2_ = local_418._8_2_;
  uStack_250._2_2_ = local_418._10_2_;
  uStack_250._4_2_ = local_418._12_2_;
  uStack_250._6_2_ = local_418._14_2_;
  local_438 = (short)local_258 + 0x3f;
  sStack_436 = local_258._2_2_ + 0x3f;
  sStack_434 = local_258._4_2_ + 0x3f;
  sStack_432 = local_258._6_2_ + 0x3f;
  sStack_430 = (short)uStack_250 + 0x3f;
  sStack_42e = uStack_250._2_2_ + 0x3f;
  sStack_42c = uStack_250._4_2_ + 0x3f;
  sStack_42a = uStack_250._6_2_ + 0x3f;
  local_278 = local_428._0_8_;
  uVar5 = local_278;
  uStack_270 = local_428._8_8_;
  uVar6 = uStack_270;
  local_278._0_2_ = local_428._0_2_;
  local_278._2_2_ = local_428._2_2_;
  local_278._4_2_ = local_428._4_2_;
  local_278._6_2_ = local_428._6_2_;
  uStack_270._0_2_ = local_428._8_2_;
  uStack_270._2_2_ = local_428._10_2_;
  uStack_270._4_2_ = local_428._12_2_;
  uStack_270._6_2_ = local_428._14_2_;
  local_298 = CONCAT26(sStack_432,CONCAT24(sStack_434,CONCAT22(sStack_436,local_438)));
  uStack_290 = CONCAT26(sStack_42a,CONCAT24(sStack_42c,CONCAT22(sStack_42e,sStack_430)));
  local_2a8 = local_418._0_8_;
  uStack_2a0 = local_418._8_8_;
  local_458 = local_438 + (short)local_258;
  sStackY_456 = sStack_436 + local_258._2_2_;
  sStackY_454 = sStack_434 + local_258._4_2_;
  sStackY_452 = sStack_432 + local_258._6_2_;
  local_2b8 = CONCAT26(local_278._6_2_ + 0x3f,
                       CONCAT24(local_278._4_2_ + 0x3f,
                                CONCAT22(local_278._2_2_ + 0x3f,(short)local_278 + 0x3f)));
  uStack_2b0 = CONCAT26(uStack_270._6_2_ + 0x3f,
                        CONCAT24(uStack_270._4_2_ + 0x3f,
                                 CONCAT22(uStack_270._2_2_ + 0x3f,(short)uStack_270 + 0x3f)));
  local_2c8 = local_428._0_8_;
  uStack_2c0 = local_428._8_8_;
  local_468 = (short)local_278 + 0x3f + (short)local_278;
  sStackY_466 = local_278._2_2_ + 0x3f + local_278._2_2_;
  sStackY_464 = local_278._4_2_ + 0x3f + local_278._4_2_;
  sStackY_462 = local_278._6_2_ + 0x3f + local_278._6_2_;
  sStackY_460 = (short)uStack_270 + 0x3f + (short)uStack_270;
  sStackY_45e = uStack_270._2_2_ + 0x3f + uStack_270._2_2_;
  sStackY_45c = uStack_270._4_2_ + 0x3f + uStack_270._4_2_;
  sStackY_45a = uStack_270._6_2_ + 0x3f + uStack_270._6_2_;
  local_2d8 = CONCAT26(sStackY_452,CONCAT24(sStackY_454,CONCAT22(sStackY_456,local_458)));
  uStack_2d0 = CONCAT26(sStack_42a + uStack_250._6_2_,
                        CONCAT24(sStack_42c + uStack_250._4_2_,
                                 CONCAT22(sStack_42e + uStack_250._2_2_,
                                          sStack_430 + (short)uStack_250)));
  local_2e8 = local_418._0_8_;
  uStack_2e0 = local_418._8_8_;
  local_478 = local_458 + (short)local_258;
  sStackY_476 = sStackY_456 + local_258._2_2_;
  sStackY_474 = sStackY_454 + local_258._4_2_;
  sStackY_472 = sStackY_452 + local_258._6_2_;
  sStackY_470 = sStack_430 + (short)uStack_250 + (short)uStack_250;
  sStackY_46e = sStack_42e + uStack_250._2_2_ + uStack_250._2_2_;
  sStackY_46c = sStack_42c + uStack_250._4_2_ + uStack_250._4_2_;
  sStackY_46a = sStack_42a + uStack_250._6_2_ + uStack_250._6_2_;
  local_2f8 = CONCAT26(sStackY_462,CONCAT24(sStackY_464,CONCAT22(sStackY_466,local_468)));
  uStack_2f0 = CONCAT26(sStackY_45a,CONCAT24(sStackY_45c,CONCAT22(sStackY_45e,sStackY_460)));
  local_308 = local_428._0_8_;
  uStack_300 = local_428._8_8_;
  local_488 = local_468 + (short)local_278;
  sStackY_486 = sStackY_466 + local_278._2_2_;
  sStackY_484 = sStackY_464 + local_278._4_2_;
  sStackY_482 = sStackY_462 + local_278._6_2_;
  sStackY_480 = sStackY_460 + (short)uStack_270;
  sStackY_47e = sStackY_45e + uStack_270._2_2_;
  sStackY_47c = sStackY_45c + uStack_270._4_2_;
  sStackY_47a = sStackY_45a + uStack_270._6_2_;
  local_288 = local_3c8;
  uStack_280 = uStack_3c0;
  local_278 = uVar5;
  uStack_270 = uVar6;
  local_268 = local_3c8;
  uStack_260 = uStack_3c0;
  local_258 = uVar7;
  uStack_250 = uVar8;
  local_248 = local_3b8;
  uStack_240 = uStack_3b0;
  local_228 = local_3b8;
  uStack_220 = uStack_3b0;
  local_1f8 = local_3e8;
  uStack_1f0 = uStack_3e0;
  local_1e8 = uVar9;
  local_1d8 = local_3b8;
  uStack_1d0 = uStack_3b0;
  local_1b8 = local_3c8;
  uStack_1b0 = uStack_3c0;
  local_188 = local_3d8;
  uStack_180 = uStack_3d0;
  local_28 = local_3e8;
  uStack_20 = uStack_3e0;
  uStack_10 = uVar10;
  Update2Pixels_SSE2(local_318,local_340,(__m128i *)&local_438,(__m128i *)&stack0xfffffffffffffbb8);
  Update2Pixels_SSE2(local_320,local_338,(__m128i *)&local_458,(__m128i *)&local_468);
  Update2Pixels_SSE2(local_328,local_330,(__m128i *)&local_478,(__m128i *)&local_488);
  return;
}

Assistant:

static WEBP_INLINE void DoFilter6_SSE2(__m128i* const p2, __m128i* const p1,
                                       __m128i* const p0, __m128i* const q0,
                                       __m128i* const q1, __m128i* const q2,
                                       const __m128i* const mask,
                                       int hev_thresh) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  __m128i a, not_hev;

  // compute hev mask
  GetNotHEV_SSE2(p1, p0, q0, q1, hev_thresh, &not_hev);

  FLIP_SIGN_BIT4(*p1, *p0, *q0, *q1);
  FLIP_SIGN_BIT2(*p2, *q2);
  GetBaseDelta_SSE2(p1, p0, q0, q1, &a);

  { // do simple filter on pixels with hev
    const __m128i m = _mm_andnot_si128(not_hev, *mask);
    const __m128i f = _mm_and_si128(a, m);
    DoSimpleFilter_SSE2(p0, q0, &f);
  }

  { // do strong filter on pixels with not hev
    const __m128i k9 = _mm_set1_epi16(0x0900);
    const __m128i k63 = _mm_set1_epi16(63);

    const __m128i m = _mm_and_si128(not_hev, *mask);
    const __m128i f = _mm_and_si128(a, m);

    const __m128i f_lo = _mm_unpacklo_epi8(zero, f);
    const __m128i f_hi = _mm_unpackhi_epi8(zero, f);

    const __m128i f9_lo = _mm_mulhi_epi16(f_lo, k9);    // Filter (lo) * 9
    const __m128i f9_hi = _mm_mulhi_epi16(f_hi, k9);    // Filter (hi) * 9

    const __m128i a2_lo = _mm_add_epi16(f9_lo, k63);    // Filter * 9 + 63
    const __m128i a2_hi = _mm_add_epi16(f9_hi, k63);    // Filter * 9 + 63

    const __m128i a1_lo = _mm_add_epi16(a2_lo, f9_lo);  // Filter * 18 + 63
    const __m128i a1_hi = _mm_add_epi16(a2_hi, f9_hi);  // Filter * 18 + 63

    const __m128i a0_lo = _mm_add_epi16(a1_lo, f9_lo);  // Filter * 27 + 63
    const __m128i a0_hi = _mm_add_epi16(a1_hi, f9_hi);  // Filter * 27 + 63

    Update2Pixels_SSE2(p2, q2, &a2_lo, &a2_hi);
    Update2Pixels_SSE2(p1, q1, &a1_lo, &a1_hi);
    Update2Pixels_SSE2(p0, q0, &a0_lo, &a0_hi);
  }
}